

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

void __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  cmOutputConverter *this_00;
  ulong uVar1;
  string *psVar2;
  ostream *poVar3;
  string_view str;
  undefined1 local_3d8 [8];
  string remainingLibs;
  string local_3a8;
  undefined1 local_388 [8];
  string rpath_link;
  ostringstream fout;
  undefined1 local_1f0 [8];
  string rpath;
  string local_1c0;
  undefined1 local_1a0 [8];
  ostringstream rpathOut;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibraries_local;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  ComputeRPath_abi_cxx11_(&local_1c0,this,cli);
  std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
  }
  ComputeLinkLibs(this,cli,linkLibraries);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(rpath_link.field_2._M_local_buf + 8))
  ;
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_((string *)local_388,cli);
  cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(cli);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      psVar2 = cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(cli);
      std::operator<<((ostream *)((long)&rpath_link.field_2 + 8),(string *)psVar2);
      this_00 = this->OutputConverter;
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_388);
      remainingLibs.field_2._8_8_ = str._M_len;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_3a8,this_00,str,(bool)(~this->ForResponse & 1),false,false,false,false);
      std::operator<<((ostream *)((long)&rpath_link.field_2 + 8),(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::operator<<((ostream *)((long)&rpath_link.field_2 + 8)," ");
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)((long)&rpath_link.field_2 + 8),(string *)stdLibString);
    std::operator<<(poVar3," ");
  }
  std::__cxx11::ostringstream::str();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  }
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(rpath_link.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  std::ostringstream rpathOut;
  rpathOut << this->ComputeRPath(cli);

  std::string rpath = rpathOut.str();
  if (!rpath.empty()) {
    linkLibraries.emplace_back(std::move(rpath));
  }

  // Write the library flags to the build rule.
  this->ComputeLinkLibs(cli, linkLibraries);

  // Add the linker runtime search path if any.
  std::ostringstream fout;
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  std::string remainingLibs = fout.str();
  if (!remainingLibs.empty()) {
    linkLibraries.emplace_back(remainingLibs);
  }
}